

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O3

void cmn_live(cmn_t *cmn,mfcc_t **incep,int32 varnorm,int32 nfr)

{
  int iVar1;
  float *pfVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (nfr < 1) {
    return;
  }
  if (varnorm != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
            ,0x79,"Variance normalization not implemented in live mode decode\n");
    exit(1);
  }
  uVar6 = 0;
  do {
    pfVar2 = (float *)incep[uVar6];
    if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
      iVar1 = cmn->veclen;
      if (0 < (long)iVar1) {
        pmVar3 = cmn->cmn_mean;
        pmVar4 = cmn->sum;
        lVar8 = 0;
        do {
          pmVar4[lVar8] = (mfcc_t)(pfVar2[lVar8] + (float)pmVar4[lVar8]);
          pfVar2[lVar8] = pfVar2[lVar8] - (float)pmVar3[lVar8];
          lVar8 = lVar8 + 1;
        } while (iVar1 != lVar8);
      }
      cmn->nframe = cmn->nframe + 1;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != (uint)nfr);
  if (cmn->nframe < 0x321) {
    return;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x47,"Update from < %s >\n",cmn->repr);
  iVar1 = cmn->nframe;
  lVar8 = (long)cmn->veclen;
  if (lVar8 < 1) {
    if (iVar1 < 800) goto LAB_00126d3f;
  }
  else {
    pmVar3 = cmn->cmn_mean;
    pmVar4 = cmn->sum;
    lVar7 = 0;
    do {
      pmVar3[lVar7] = (mfcc_t)((float)pmVar4[lVar7] / (float)iVar1);
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
    if (iVar1 < 800) goto LAB_00126d3f;
    lVar7 = 0;
    do {
      pmVar4[lVar7] = (mfcc_t)((float)pmVar4[lVar7] * (1.0 / (float)iVar1) * 500.0);
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  cmn->nframe = 500;
LAB_00126d3f:
  pcVar5 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
          ,0x53,"Update to   < %s >\n",pcVar5);
  return;
}

Assistant:

void
cmn_live(cmn_t *cmn, mfcc_t **incep, int32 varnorm, int32 nfr)
{
    int32 i, j;

    if (nfr <= 0)
        return;

    if (varnorm)
        E_FATAL
            ("Variance normalization not implemented in live mode decode\n");

    for (i = 0; i < nfr; i++) {

	/* Skip zero energy frames */
	if (incep[i][0] < 0)
	    continue;

        for (j = 0; j < cmn->veclen; j++) {
            cmn->sum[j] += incep[i][j];
            incep[i][j] -= cmn->cmn_mean[j];
        }

        ++cmn->nframe;
    }

    /* Shift buffer down if we have more than CMN_WIN_HWM frames */
    if (cmn->nframe > CMN_WIN_HWM)
        cmn_live_shiftwin(cmn);
}